

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::PrintFullTestCommentIfPresent(internal *this,TestInfo *test_info)

{
  pointer pcVar1;
  long lVar2;
  
  if (this == (internal *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = *(long *)this;
  }
  if (test_info == (TestInfo *)0x0) {
    pcVar1 = (pointer)0x0;
  }
  else {
    pcVar1 = (test_info->test_suite_name_)._M_dataplus._M_p;
  }
  if (lVar2 == 0 && pcVar1 == (pointer)0x0) {
    return;
  }
  printf(", where ");
  if (lVar2 == 0) {
    if (pcVar1 == (pointer)0x0) {
      return;
    }
  }
  else {
    printf("%s = %s","TypeParam",lVar2);
    if (pcVar1 == (pointer)0x0) {
      return;
    }
    printf(" and ");
  }
  printf("%s = %s","GetParam()",pcVar1);
  return;
}

Assistant:

void RegisterTypeParameterizedTestSuite(const char* test_suite_name,
                                        CodeLocation code_location) {
  GetUnitTestImpl()->type_parameterized_test_registry().RegisterTestSuite(
      test_suite_name, code_location);
}